

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.cpp
# Opt level: O2

int __thiscall ZipArchive::close(ZipArchive *this,int __fd)

{
  File *this_00;
  uchar *target;
  undefined2 uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  EndOfCentralDir64 *t;
  undefined2 uVar5;
  char cVar6;
  uint uVar7;
  EndOfCentralDir64 local_78;
  size_t local_40;
  size_t endCD;
  
  this_00 = &this->f;
  sVar3 = File::tell(this_00);
  target = (this->entries)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  File::Write<unsigned_char>(this_00,target,(long)this->entryPtr - (long)target);
  sVar4 = File::tell(this_00);
  local_40 = File::tell(this_00);
  cVar6 = this->force64;
  if ((bool)cVar6 == false) {
    if (0xfffe < this->entryCount) {
      cVar6 = '\x01';
    }
    if (0xfffffffe < sVar3) {
      cVar6 = '\x01';
    }
  }
  endCD = sVar3;
  if (cVar6 != '\0') {
    local_78.id = 0x6064b50;
    local_78.size = 0x2c;
    local_78.v0 = 0x31e;
    local_78.v1 = 0x2d;
    local_78.disk = 0;
    local_78.cddisk = 0;
    local_78.diskentries = this->entryCount;
    local_78.entries = local_78.diskentries;
    local_78.cdsize = sVar4 - sVar3;
    local_78.cdoffset = sVar3;
    File::Write<EndOfCentralDir64>(this_00,&local_78);
    local_78.id = 0x7064b50;
    File::Write<unsigned_int>(this_00,&local_78.id);
    local_78.id = 0;
    File::Write<unsigned_int>(this_00,&local_78.id);
    File::Write<unsigned_long>(this_00,&local_40);
    local_78.id = 1;
    File::Write<unsigned_int>(this_00,&local_78.id);
  }
  local_78.id = 0x6054b50;
  File::Write<unsigned_int>(this_00,&local_78.id);
  local_78.id = local_78.id & 0xffff0000;
  File::Write<unsigned_short>(this_00,(unsigned_short *)&local_78);
  local_78.id = local_78.id & 0xffff0000;
  File::Write<unsigned_short>(this_00,(unsigned_short *)&local_78);
  uVar5 = 0xffff;
  uVar1 = 0xffff;
  if (cVar6 == '\0') {
    uVar1 = (undefined2)this->entryCount;
  }
  local_78.id._0_2_ = uVar1;
  File::Write<unsigned_short>(this_00,(unsigned_short *)&local_78);
  if (cVar6 == '\0') {
    uVar5 = (undefined2)this->entryCount;
    uVar7 = (uint)endCD;
  }
  else {
    uVar7 = 0xffffffff;
  }
  local_78.id = CONCAT22(local_78.id._2_2_,uVar5);
  File::Write<unsigned_short>(this_00,(unsigned_short *)&local_78);
  local_78.id = (uint32_t)(sVar4 - sVar3);
  File::Write<unsigned_int>(this_00,&local_78.id);
  local_78.id = uVar7;
  File::Write<unsigned_int>(this_00,&local_78.id);
  local_78.id = local_78.id & 0xffff0000;
  t = &local_78;
  File::Write<unsigned_short>(this_00,(unsigned_short *)t);
  iVar2 = File::close(this_00,(int)t);
  return iVar2;
}

Assistant:

void ZipArchive::close()
{
    auto startCD = f.tell(); // tell_x(fp);

    write(entries.get(), entryPtr - entries.get());
    auto sizeCD = f.tell() - startCD;

    auto endCD = f.tell();

    bool end64 = force64;
    if (!end64) {
        if (entryCount > 0xfffe || startCD > 0xfffffffeL)
            end64 = true;
    }

    if (end64) {
        write<EndOfCentralDir64>({0x06064b50, 44, 0x031e, 45, 0, 0, entryCount,
                                  entryCount, (int64_t)sizeCD,
                                  (int64_t)startCD});
        // Locator
        write<uint32_t>(0x07064b50);
        write<uint32_t>(0);
        write<uint64_t>(endCD);
        write<uint32_t>(1);
    }
    write<uint32_t>(0x06054b50);
    write<uint16_t>(0);
    write<uint16_t>(0);
    write<uint16_t>(end64 ? 0xffff : entryCount);
    write<uint16_t>(end64 ? 0xffff : entryCount);
    write<uint32_t>(sizeCD);
    write<uint32_t>(end64 ? 0xffffffff : startCD);
    write<uint16_t>(0);

    f.close();
}